

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icpu_helpers.cpp
# Opt level: O2

void n_e_s::core::PrintTo(CpuRegisters *r,ostream *os)

{
  byte bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string sStack_b8;
  char *local_98 [2];
  char *local_88;
  char *local_78;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_68;
  char *local_58;
  char *local_48;
  char *local_38;
  char *local_28;
  
  local_98[0] = (char *)(ulong)r->pc;
  local_88 = (char *)(ulong)r->sp;
  local_78 = (char *)(ulong)r->a;
  local_68 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
              )(ulong)r->x;
  local_58 = (char *)(ulong)r->y;
  fmt.size_ = 0x22222;
  fmt.data_ = (char *)0x38;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_98;
  ::fmt::v8::vformat_abi_cxx11_
            (&sStack_b8,(v8 *)"PC: {:#06x} SP: {:#04x} A: {:#04x} x: {:#04x} Y: {:#04x}",fmt,args);
  std::operator<<(os,(string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  bVar1 = r->p;
  local_98[0] = "N";
  if (-1 < (char)bVar1) {
    local_98[0] = "-";
  }
  local_88 = "V";
  if ((bVar1 & 0x40) == 0) {
    local_88 = "-";
  }
  local_78 = "5";
  if ((bVar1 & 0x20) == 0) {
    local_78 = "-";
  }
  local_68.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)0x1fefa9;
  if ((bVar1 & 0x10) == 0) {
    local_68.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)0x20522b;
  }
  local_58 = "D";
  if ((bVar1 & 8) == 0) {
    local_58 = "-";
  }
  local_48 = "I";
  if ((bVar1 & 4) == 0) {
    local_48 = "-";
  }
  local_38 = "Z";
  if ((bVar1 & 2) == 0) {
    local_38 = "-";
  }
  local_28 = "C";
  if ((bVar1 & 1) == 0) {
    local_28 = "-";
  }
  fmt_00.size_ = 0xcccccccc;
  fmt_00.data_ = (char *)0x14;
  args_00.field_1.values_ = local_68.values_;
  args_00.desc_ = (unsigned_long_long)local_98;
  ::fmt::v8::vformat_abi_cxx11_(&sStack_b8,(v8 *)" P: {}{}{}{}{}{}{}{}",fmt_00,args_00);
  std::operator<<(os,(string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void PrintTo(const CpuRegisters &r, std::ostream *os) {
    *os << fmt::format(
            "PC: {:#06x} SP: {:#04x} A: {:#04x} x: {:#04x} Y: {:#04x}",
            r.pc,
            r.sp,
            r.a,
            r.x,
            r.y);
    *os << fmt::format(" P: {}{}{}{}{}{}{}{}",
            r.p & N_FLAG ? "N" : "-",
            r.p & V_FLAG ? "V" : "-",
            r.p & FLAG_5 ? "5" : "-",
            r.p & B_FLAG ? "B" : "-",
            r.p & D_FLAG ? "D" : "-",
            r.p & I_FLAG ? "I" : "-",
            r.p & Z_FLAG ? "Z" : "-",
            r.p & C_FLAG ? "C" : "-");
    *os << std::endl;
}